

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv>::SingletonEnv
          (SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv> *this)

{
  SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv> *this_local;
  
  std::atomic<bool>::store
            ((atomic<bool> *)
             &(anonymous_namespace)::SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv>::
              env_initialized_,true,memory_order_relaxed);
  PosixEnv::PosixEnv((PosixEnv *)this);
  return;
}

Assistant:

SingletonEnv() {
#if !defined(NDEBUG)
    env_initialized_.store(true, std::memory_order::memory_order_relaxed);
#endif  // !defined(NDEBUG)
    static_assert(sizeof(env_storage_) >= sizeof(EnvType),
                  "env_storage_ will not fit the Env");
    static_assert(alignof(decltype(env_storage_)) >= alignof(EnvType),
                  "env_storage_ does not meet the Env's alignment needs");
    new (&env_storage_) EnvType();
  }